

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O2

void __thiscall
Class::Class(Class *this,Group *classGroup,Subject *classSubject,Room *classRoom,
            Teacher *classTeacher,Time *classTime)

{
  size_t sVar1;
  undefined4 uVar2;
  
  Group::Group(&this->group,classGroup);
  Subject::Subject(&this->subject,classSubject);
  uVar2 = *(undefined4 *)&classRoom->field_0x4;
  sVar1 = classRoom->capacity;
  (this->room).number = classRoom->number;
  *(undefined4 *)&(this->room).field_0x4 = uVar2;
  (this->room).capacity = sVar1;
  std::__cxx11::string::string((string *)&this->teacher,(string *)classTeacher);
  Time::Time(&this->time,classTime);
  return;
}

Assistant:

Class(Group classGroup,
          Subject classSubject,
          const Room& classRoom,
          Teacher classTeacher,
          Time classTime) :
            group(move(classGroup)),
            subject(move(classSubject)),
            room(classRoom),
            teacher(move(classTeacher)),
            time(move(classTime)) {}